

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O1

string * __thiscall CNetAddr::ToStringAddr_abi_cxx11_(string *__return_storage_ptr__,CNetAddr *this)

{
  uint uVar1;
  pointer pcVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  uint32_t scope_id;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  uint uVar6;
  long in_FS_OFFSET;
  Span<const_unsigned_char> input;
  Span<const_unsigned_char> addr;
  Span<const_unsigned_char> a;
  Span<const_unsigned_char> input_00;
  _Alloc_hider in_stack_ffffffffffffffc8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  long local_18;
  CNetAddr *pCVar7;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(this->m_net) {
  case NET_UNROUTABLE:
  case NET_MAX:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netaddress.cpp"
                  ,0x259,"std::string CNetAddr::ToStringAddr() const");
  case NET_IPV4:
    if (0x10 < (this->m_addr)._size) {
      this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      tinyformat::format<unsigned_char,unsigned_char,unsigned_char,unsigned_char>
                (__return_storage_ptr__,(tinyformat *)"%u.%u.%u.%u",(char *)this,
                 (uchar *)((this->m_addr)._union.direct + 1),
                 (uchar *)((this->m_addr)._union.direct + 2),
                 (uchar *)((this->m_addr)._union.direct + 3),(uchar *)in_stack_ffffffffffffffc8._M_p
                );
      return __return_storage_ptr__;
    }
    break;
  case NET_IPV6:
    uVar1 = (this->m_addr)._size;
    scope_id = this->m_scope_id;
    uVar6 = uVar1 - 0x11;
    pCVar7 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    if (uVar1 < 0x11) {
      uVar6 = uVar1;
      pCVar7 = this;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
LAB_006d02bb:
      a.m_size._0_4_ = uVar6;
      a.m_data = (uchar *)pCVar7;
      a.m_size._4_4_ = 0;
      IPv6ToString_abi_cxx11_(__return_storage_ptr__,a,scope_id);
      return __return_storage_ptr__;
    }
    break;
  case NET_ONION:
    uVar1 = (this->m_addr)._size;
    uVar6 = uVar1 - 0x11;
    pCVar7 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    if (uVar1 < 0x11) {
      uVar6 = uVar1;
      pCVar7 = this;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      addr.m_size._0_4_ = uVar6;
      addr.m_data = (uchar *)pCVar7;
      addr.m_size._4_4_ = 0;
      OnionToString_abi_cxx11_(__return_storage_ptr__,addr);
      return __return_storage_ptr__;
    }
    break;
  case NET_I2P:
    uVar1 = (this->m_addr)._size;
    uVar6 = uVar1 - 0x11;
    pCVar7 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    if (uVar1 < 0x11) {
      uVar6 = uVar1;
      pCVar7 = this;
    }
    input_00.m_size._0_4_ = uVar6;
    input_00.m_data = (uchar *)pCVar7;
    input_00.m_size._4_4_ = 0;
    EncodeBase32_abi_cxx11_((string *)&stack0xffffffffffffffc8,input_00,false);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &stack0xffffffffffffffc8,".b32.i2p");
    goto LAB_006d02f3;
  case NET_CJDNS:
    uVar1 = (this->m_addr)._size;
    uVar6 = uVar1 - 0x11;
    pCVar7 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    if (uVar1 < 0x11) {
      uVar6 = uVar1;
      pCVar7 = this;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      scope_id = 0;
      goto LAB_006d02bb;
    }
    break;
  case NET_INTERNAL:
    uVar1 = (this->m_addr)._size;
    uVar6 = uVar1 - 0x11;
    pCVar7 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    if (uVar1 < 0x11) {
      uVar6 = uVar1;
      pCVar7 = this;
    }
    input.m_size._0_4_ = uVar6;
    input.m_data = (uchar *)pCVar7;
    input.m_size._4_4_ = 0;
    EncodeBase32_abi_cxx11_((string *)&stack0xffffffffffffffc8,input,true);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &stack0xffffffffffffffc8,".internal");
LAB_006d02f3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar5) {
      uVar3 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffffc8._M_p != &local_28) {
      operator_delete(in_stack_ffffffffffffffc8._M_p,local_28._M_allocated_capacity + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return __return_storage_ptr__;
    }
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netaddress.cpp"
                  ,0x25c,"std::string CNetAddr::ToStringAddr() const");
  }
  __stack_chk_fail();
}

Assistant:

std::string CNetAddr::ToStringAddr() const
{
    switch (m_net) {
    case NET_IPV4:
        return IPv4ToString(m_addr);
    case NET_IPV6:
        return IPv6ToString(m_addr, m_scope_id);
    case NET_ONION:
        return OnionToString(m_addr);
    case NET_I2P:
        return EncodeBase32(m_addr, false /* don't pad with = */) + ".b32.i2p";
    case NET_CJDNS:
        return IPv6ToString(m_addr, 0);
    case NET_INTERNAL:
        return EncodeBase32(m_addr) + ".internal";
    case NET_UNROUTABLE: // m_net is never and should not be set to NET_UNROUTABLE
    case NET_MAX:        // m_net is never and should not be set to NET_MAX
        assert(false);
    } // no default case, so the compiler can warn about missing cases

    assert(false);
}